

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void fill_MPP_FMT_RGB565(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  
  iVar2 = (G & 0xfc) << 3;
  bVar3 = (byte)R & 0xf8 | (byte)((uint)iVar2 >> 8);
  bVar1 = (byte)(B >> 3) & 0x1f | (byte)iVar2;
  bVar4 = bVar3;
  if (be == 0) {
    bVar4 = bVar1;
    bVar1 = bVar3;
  }
  *p = bVar4;
  p[1] = bVar1;
  return;
}

Assistant:

static void fill_MPP_FMT_RGB565(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB565 = ffmpeg: rgb565be
    // 16 bit pixel     MSB  -------->  LSB
    //                 (rrrr,rggg,gggb,bbbb)
    // big    endian   |  byte 0 |  byte 1 |
    // little endian   |  byte 1 |  byte 0 |
    RK_U16 val = (((R >> 3) & 0x1f) << 11) |
                 (((G >> 2) & 0x3f) <<  5) |
                 (((B >> 3) & 0x1f) <<  0);
    if (be) {
        p[0] = (val >> 8) & 0xff;
        p[1] = (val >> 0) & 0xff;
    } else {
        p[0] = (val >> 0) & 0xff;
        p[1] = (val >> 8) & 0xff;
    }
}